

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

GCstr * lj_ctype_repr_complex(lua_State *L,void *sp,CTSize size)

{
  SBuf *sb;
  GCstr *pGVar1;
  ulong uVar2;
  lua_Number n;
  double n_00;
  
  uVar2 = (ulong)(L->glref).ptr32;
  sb = (SBuf *)(uVar2 + 0xe8);
  *(int *)(uVar2 + 0xf4) = (int)L;
  *(undefined4 *)(uVar2 + 0xe8) = *(undefined4 *)(uVar2 + 0xf0);
  if (size == 0x10) {
    n = *sp;
    n_00 = *(double *)((long)sp + 8);
  }
  else {
    n = (lua_Number)*sp;
    n_00 = (double)*(float *)((long)sp + 4);
  }
  lj_strfmt_putfnum(sb,0xf000035,n);
  if (NAN(n_00) || -1 < (long)n_00) {
    lj_buf_putchar(sb,0x2b);
  }
  lj_strfmt_putfnum(sb,0xf000035,n_00);
  lj_buf_putchar(sb,(uint)(*(char *)((ulong)*(uint *)(uVar2 + 0xe8) - 1) < 'a') << 5 | 0x49);
  pGVar1 = lj_str_new(L,(char *)(ulong)*(uint *)(uVar2 + 0xf0),
                      (ulong)(*(int *)(uVar2 + 0xe8) - *(uint *)(uVar2 + 0xf0)));
  return pGVar1;
}

Assistant:

GCstr *lj_ctype_repr_complex(lua_State *L, void *sp, CTSize size)
{
  SBuf *sb = lj_buf_tmp_(L);
  TValue re, im;
  if (size == 2*sizeof(double)) {
    re.n = *(double *)sp; im.n = ((double *)sp)[1];
  } else {
    re.n = (double)*(float *)sp; im.n = (double)((float *)sp)[1];
  }
  lj_strfmt_putfnum(sb, STRFMT_G14, re.n);
  if (!(im.u32.hi & 0x80000000u) || im.n != im.n) lj_buf_putchar(sb, '+');
  lj_strfmt_putfnum(sb, STRFMT_G14, im.n);
  lj_buf_putchar(sb, sbufP(sb)[-1] >= 'a' ? 'I' : 'i');
  return lj_buf_str(L, sb);
}